

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

void byte_array_print(char *s)

{
  bool bVar1;
  byte *pbStack_18;
  bool started;
  uchar *d;
  char *s_local;
  
  bVar1 = false;
  printf("[");
  for (pbStack_18 = (byte *)s; *pbStack_18 != 0; pbStack_18 = pbStack_18 + 1) {
    if (bVar1) {
      printf(",");
    }
    bVar1 = true;
    printf("0x%02X",(ulong)*pbStack_18);
  }
  printf("]");
  return;
}

Assistant:

static void byte_array_print(char const* s)
{
  unsigned char const* d = reinterpret_cast<unsigned char const*>(s);
  bool started = false;
  printf("[");
  for (; *d; ++d) {
    if (started) {
      printf(",");
    }
    started = true;
    printf("0x%02X", static_cast<int>(*d));
  }
  printf("]");
}